

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.h
# Opt level: O0

void __thiscall
gimage::Polygon::draw<unsigned_char>
          (Polygon *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float r,
          float g,float b)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_> *in_RDI;
  size_t i;
  size_t j;
  float in_stack_00000048;
  long in_stack_00000068;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_00000070;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                       (in_RDI);
  local_28 = local_28 - 1;
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                      (in_RDI);
    if (sVar1 <= local_30) break;
    pvVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[](in_RDI,local_30);
    gmath::SVector<long,_2>::operator[](pvVar2,0);
    pvVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[](in_RDI,local_30);
    gmath::SVector<long,_2>::operator[](pvVar2,1);
    pvVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[](in_RDI,local_28);
    gmath::SVector<long,_2>::operator[](pvVar2,0);
    pvVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
             operator[](in_RDI,local_28);
    gmath::SVector<long,_2>::operator[](pvVar2,1);
    drawLine<unsigned_char>
              (in_stack_00000070,in_stack_00000068,(long)this,(long)image,CONCAT44(r,g),b,
               in_stack_00000048,j._4_4_);
    local_28 = local_30;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void draw(Image<T> &image, float r, float g=-1, float b=-1) const
    {
      size_t j=vertex.size()-1;
      for (size_t i=0; i<vertex.size(); i++)
      {
        drawLine(image, vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1], r, g, b);
        j=i;
      }
    }